

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::
rayTestSingleInternal(btTransform_const&,btTransform_const&,btCollisionObjectWrapper_const*,btCollisionWorld
::RayResultCallback&)::RayTester::
RayTester(btCollisionObject_const*,btCompoundShape_const*,btTransform_const&,btTransform_const&,btTransform_const&,btCollisionWorld
::RayResultCallback__
          (RayTester *this,btCollisionObject *collisionObject,btCompoundShape *compoundShape,
          btTransform *colObjWorldTransform,btTransform *rayFromTrans,btTransform *rayToTrans,
          RayResultCallback *resultCallback)

{
  _func_int **in_RCX;
  _func_int **in_RDX;
  _func_int **in_RSI;
  ICollide *in_RDI;
  _func_int **in_R8;
  _func_int **in_R9;
  
  btDbvt::ICollide::ICollide(in_RDI);
  in_RDI->_vptr_ICollide = (_func_int **)&PTR__RayTester_002e28d0;
  in_RDI[1]._vptr_ICollide = in_RSI;
  in_RDI[2]._vptr_ICollide = in_RDX;
  in_RDI[3]._vptr_ICollide = in_RCX;
  in_RDI[4]._vptr_ICollide = in_R8;
  in_RDI[5]._vptr_ICollide = in_R9;
  in_RDI[6]._vptr_ICollide = (_func_int **)rayToTrans;
  return;
}

Assistant:

RayTester(const btCollisionObject* collisionObject,
							const btCompoundShape* compoundShape,
							const btTransform& colObjWorldTransform,
							const btTransform& rayFromTrans,
							const btTransform& rayToTrans,
							RayResultCallback& resultCallback):
						m_collisionObject(collisionObject),
						m_compoundShape(compoundShape),
						m_colObjWorldTransform(colObjWorldTransform),
						m_rayFromTrans(rayFromTrans),
						m_rayToTrans(rayToTrans),
						m_resultCallback(resultCallback)
					{
						
					}